

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::sgd::eval(sgd *this,vec3 *wi,vec3 *wo,void *param_3)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  vec3 *wi_00;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  value_type vVar9;
  value_type Kd;
  value_type Ks;
  value_type F;
  value_type D;
  value_type G;
  float local_78;
  float fStack_74;
  undefined1 local_68 [8];
  value_type *local_60;
  value_type *local_58;
  sgd *local_50;
  sgd *local_48;
  float local_40;
  _Vt local_38;
  
  if ((wo->z <= 0.0) || (*(float *)((long)param_3 + 8) <= 0.0)) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar5 = extraout_RDX_00;
  }
  else {
    vVar8 = operator+(wo,(vec3 *)param_3);
    local_68 = vVar8._0_8_;
    local_60 = (value_type *)CONCAT44(local_60._4_4_,vVar8.z);
    vVar8 = normalize((vec3 *)local_68);
    lVar2 = *(long *)&wi[1].y;
    dVar1 = *(double *)(lVar2 + 0x38);
    Ks._M_size = 3;
    dVar3 = *(double *)(lVar2 + 0x28);
    dVar4 = *(double *)(lVar2 + 0x30);
    Ks._M_data = (float *)operator_new(0xc);
    *(ulong *)Ks._M_data = CONCAT44((float)dVar4,(float)dVar3);
    Ks._M_data[2] = (float)dVar1;
    lVar2 = *(long *)&wi[1].y;
    dVar3 = *(double *)(lVar2 + 0x10);
    dVar4 = *(double *)(lVar2 + 0x18);
    dVar1 = *(double *)(lVar2 + 0x20);
    Kd._M_size = 3;
    Kd._M_data = (float *)operator_new(0xc);
    local_78 = vVar8.x;
    fStack_74 = vVar8.y;
    *(ulong *)Kd._M_data = CONCAT44((float)dVar4,(float)dVar3);
    Kd._M_data[2] = (float)dVar1;
    fVar6 = vVar8.z * wo->z + wo->x * local_78 + fStack_74 * wo->y;
    fVar7 = 0.0;
    if (0.0 <= fVar6) {
      fVar7 = fVar6;
    }
    fVar6 = 1.0;
    if (fVar7 <= 1.0) {
      fVar6 = fVar7;
    }
    (**(code **)(**(long **)&wi->z + 0x20))(fVar6,&F);
    gaf((sgd *)&G,wi,wi_00,wo);
    ndf((sgd *)&D,wi);
    local_40 = wo->z * *(float *)((long)param_3 + 8);
    local_68 = (undefined1  [8])&Kd;
    local_60 = &Ks;
    local_58 = &F;
    local_38 = 3.1415927;
    local_50 = (sgd *)&D;
    local_48 = (sgd *)&G;
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__divides,std::_Expr,std::_Constant,std::__detail::_BinClos<std::__plus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__divides,std::_Expr,std::_Constant,std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Expr,std::_ValArray,std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_ValArray,float,float>,float>>,float>>,float>>
              ((valarray<float> *)this,
               (_Expr<std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__divides,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Expr,_std::_ValArray,_std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_ValArray,_float,_float>,_float>_>,_float>_>,_float>,_float>
                *)local_68);
    operator_delete(D._M_data);
    operator_delete(G._M_data);
    operator_delete(F._M_data);
    operator_delete(Kd._M_data);
    operator_delete(Ks._M_data);
    pfVar5 = extraout_RDX;
  }
  vVar9._M_data = pfVar5;
  vVar9._M_size = (size_t)this;
  return vVar9;
}

Assistant:

brdf::value_type
sgd::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		vec3 wh = normalize(wi + wo);
		const brdf::value_type Ks = {
		    (float_t)m_data->rhoS[0],
		    (float_t)m_data->rhoS[1],
		    (float_t)m_data->rhoS[2]
		};
		const brdf::value_type Kd = {
		    (float_t)m_data->rhoD[0],
		    (float_t)m_data->rhoD[1],
		    (float_t)m_data->rhoD[2]
		};
		brdf::value_type F = m_fresnel->eval(sat(dot(wi, wh)));
		brdf::value_type G = gaf(wh, wi, wo);
		brdf::value_type D = ndf(wh);

		return ((Kd + Ks * (F * D * G) / (wi.z * wo.z)) / m_pi());
	}

	return zero_value();
}